

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
::clear(dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
        *this)

{
  size_type sVar1;
  size_type in_RDI;
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *unaff_retaddr;
  size_type new_num_buckets;
  size_type in_stack_00000020;
  size_type in_stack_00000028;
  sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  *in_stack_00000030;
  size_type new_num_buckets_00;
  
  new_num_buckets_00 = in_RDI;
  sVar1 = sparsehash_internal::
          sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
          ::min_buckets(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  if ((*(long *)(in_RDI + 0x88) != 0) || (sVar1 != *(size_type *)(in_RDI + 0x90))) {
    clear_to_size(unaff_retaddr,new_num_buckets_00);
  }
  return;
}

Assistant:

void clear() {
    // If the table is already empty, and the number of buckets is
    // already as we desire, there's nothing to do.
    const size_type new_num_buckets = settings.min_buckets(0, 0);
    if (num_elements == 0 && new_num_buckets == num_buckets) {
      return;
    }
    clear_to_size(new_num_buckets);
  }